

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::SetGlobalRecord(Psbt *this,ByteData *key,ByteData *value)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_e9;
  string local_e8;
  CfdSourceLocation local_c8;
  int local_ac;
  undefined1 local_a8 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_vec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  allocator local_61;
  string local_60;
  CfdSourceLocation local_40;
  wally_psbt *local_28;
  wally_psbt *psbt_pointer;
  ByteData *value_local;
  ByteData *key_local;
  Psbt *this_local;
  
  local_28 = (wally_psbt *)this->wally_psbt_pointer_;
  psbt_pointer = (wally_psbt *)value;
  value_local = key;
  key_local = (ByteData *)this;
  bVar1 = ByteData::IsEmpty(key);
  if (bVar1) {
    local_40.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_40.filename = local_40.filename + 1;
    local_40.line = 0xcc3;
    local_40.funcname = "SetGlobalRecord";
    logger::warn<>(&local_40,"psbt empty key error.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_60,"psbt empty key error.",&local_61);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&local_60);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,value_local);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,
                     (ByteData *)psbt_pointer);
  SetPsbtGlobal((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                &val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,local_28);
  local_ac = wally_map_sort(&local_28->unknowns,0);
  if (local_ac != 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0xccd;
    local_c8.funcname = "SetGlobalRecord";
    logger::warn<int&>(&local_c8,"wally_map_sort NG[{}]",&local_ac);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_e8,"psbt sort unknowns error.",&local_e9);
    CfdException::CfdException(pCVar2,kCfdInternalError,&local_e8);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Psbt::SetGlobalRecord(const ByteData &key, const ByteData &value) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (key.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "psbt empty key error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt empty key error.");
  }
  auto key_vec = key.GetBytes();
  auto val_vec = value.GetBytes();

  SetPsbtGlobal(key_vec, val_vec, psbt_pointer);

  int ret = wally_map_sort(&psbt_pointer->unknowns, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt sort unknowns error.");
  }
}